

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

err_t MetaGet(node *p,dataid Id,void *Data,size_t Size)

{
  uint uVar1;
  ulong *puVar2;
  size_t __n;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint *puVar7;
  nodedata *pnVar8;
  err_t unaff_R12;
  ulong uVar9;
  nodedata *In;
  
  puVar2 = *(ulong **)((long)p->VMT + -0x28);
  if (puVar2 == (ulong *)0x0) {
    return -4;
  }
  uVar5 = *puVar2;
  uVar9 = uVar5 >> 0x3f;
  if (-1 < (long)uVar5) {
    lVar6 = 0;
    do {
      uVar4 = lVar6 + uVar5 >> 1;
      if (Id < puVar2[uVar4 * 2 + 1]) {
        uVar5 = uVar4 - 1;
      }
      else {
        if (Id <= puVar2[uVar4 * 2 + 1]) {
          puVar7 = (uint *)puVar2[uVar4 * 2 + 2];
          if ((char)*puVar7 == '&') {
            uVar4 = uVar4 - 1;
            puVar7 = (uint *)puVar2[uVar4 * 2 + 2];
          }
          else if ((char)*puVar7 == '(') {
            unaff_R12 = (**(code **)(puVar7 + 2))(p,Id,Data,Size);
            break;
          }
          uVar1 = *puVar7;
          if ((uVar1 & 0xc0) != 0x40) {
            __assert_fail("(m->Meta & META_MODE_MASK)==META_MODE_DATA",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                          ,0x818,"err_t MetaGet(node *, dataid, void *, size_t)");
          }
          uVar3 = uVar1 & 0x3f;
          if (*(long *)(puVar7 + 2) < 0) {
            pnVar8 = (nodedata *)&p->Data;
            In = (nodedata *)0x0;
            goto LAB_0011a3fd;
          }
          In = (nodedata *)((long)&p->FourCC + *(long *)(puVar7 + 2));
          goto LAB_0011a41b;
        }
        lVar6 = uVar4 + 1;
      }
      uVar9 = (ulong)((long)uVar5 < lVar6);
    } while (lVar6 <= (long)uVar5);
  }
  goto LAB_0011a4a8;
  while (pnVar8->Code != (Id << 8 | (ulong)uVar3)) {
LAB_0011a3fd:
    pnVar8 = pnVar8->Next;
    if (pnVar8 == (nodedata *)0x0) goto LAB_0011a412;
  }
  In = pnVar8 + 1;
LAB_0011a412:
  if (In == (nodedata *)0x0) {
    if (((char)puVar7[4] != '\x02') || (unaff_R12 = -3, (puVar7[6] & 0x10) == 0)) {
      unaff_R12 = 0;
      memset(Data,0,Size);
    }
  }
  else {
LAB_0011a41b:
    if (uVar3 == 0x18) {
      if ((puVar2[uVar4 * 2 + 3] != Id) || (*(char *)puVar2[uVar4 * 2 + 4] != '&')) {
        __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x834,"err_t MetaGet(node *, dataid, void *, size_t)");
      }
      unaff_R12 = -3;
      if (Size != 8) goto LAB_0011a4a8;
      *(ulong *)Data =
           (ulong)((*(uint *)((char *)puVar2[uVar4 * 2 + 4] + 8) & *(uint *)&In->Next) != 0);
    }
    else if (uVar3 == 4) {
      tcscpy_s((tchar_t *)Data,Size,(tchar_t *)In);
    }
    else {
      __n = Node_MaxDataSize(p,(ulong)(uVar1 >> 8),(ulong)uVar3,0x28);
      if (__n != Size) {
        __assert_fail("Size == DataSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x83d,"err_t MetaGet(node *, dataid, void *, size_t)");
      }
      if (__n == 4) {
        *(undefined4 *)Data = *(undefined4 *)&In->Next;
      }
      else {
        memcpy(Data,In,__n);
      }
    }
    unaff_R12 = 0;
  }
LAB_0011a4a8:
  if (uVar9 != 0) {
    return -4;
  }
  return unaff_R12;
}

Assistant:

static err_t MetaGet(node* p,dataid Id,void* Data,size_t Size)
{
    const nodeclass* Class = NodeGetClass(p);
    nodemetalookuphead* Head = Class->MetaGet;
    if (Head)
    {
        nodemetalookup* Lookup = (nodemetalookup*)(Head+1);
        intptr_t Mid;
        intptr_t Lower = 0;
        intptr_t Upper = Head->Upper;

        while (Upper >= Lower)
        {
            Mid = (Upper + Lower) >> 1;

            if (Lookup[Mid].Id>Id)
                Upper = Mid-1;
            else if (Lookup[Mid].Id<Id)
                Lower = Mid+1;
            else
            {
                const nodemeta* m = Lookup[Mid].Meta;
                const void* Ptr;
                datatype Type;

                if (m->Meta == META_PARAM_GET)
                    return ((err_t(*)(node*,dataid,void*,size_t))m->Data)(p,Id,Data,Size);

                if (m->Meta == META_PARAM_BIT)
                    m = Lookup[--Mid].Meta;

                assert((m->Meta & META_MODE_MASK)==META_MODE_DATA);

                Type = (m->Meta & TYPE_MASK);
                if ((intptr_t)m->Data<0)
                {
                    Ptr = Node_GetData(p,Id,Type);
                    if (!Ptr)
                    {
#if defined(CONFIG_CORECDOC)
                        if (m[2].Meta == META_PARAM_DATA_FLAGS && (m[2].Data & DFLAG_NODEFAULT))
#else
                        if (m[1].Meta == META_PARAM_DATA_FLAGS && (m[1].Data & DFLAG_NODEFAULT))
#endif
                            return ERR_INVALID_DATA;

                        memset(Data,0,Size);
                        return ERR_NONE;
                    }
                }
                else
                    Ptr = (const uint8_t*)p + (intptr_t)m->Data;

                if (Type == TYPE_STRING)
                    tcscpy_s(Data,Size/sizeof(tchar_t),(const tchar_t*)Ptr);
                else
                if (Type == TYPE_BOOL_BIT)
                {
                    uint32_t Bit;
                    assert(Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT);
                    Bit = (uint32_t)Lookup[Mid+1].Meta->Data;
                    if (Size != sizeof(bool_t))
                        return ERR_INVALID_DATA;
                    *(bool_t*)Data = (*(const uint32_t*)Ptr & Bit) != 0;
                }
                else
                {
                    size_t DataSize = Node_MaxDataSize(p,m->Id,Type,META_PARAM_GET);
                    assert(Size == DataSize);
                    if (DataSize != Size)
                        return ERR_INVALID_DATA;

                    if (DataSize==sizeof(int))
                        *(int*)Data = *(const int*)Ptr;
                    else
                        memcpy(Data,Ptr,DataSize);
                }

                return ERR_NONE;
            }
        }
    }
    return ERR_INVALID_PARAM;
}